

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_mem_legacy.c
# Opt level: O2

RK_S32 get_free_memory_num(vpu_display_mem_pool *p)

{
  RK_S32 RVar1;
  
  if (p[1].commit_hdl == (_func_RK_S32_vpu_display_mem_pool_ptr_RK_S32_RK_S32 *)0x0) {
    RVar1 = 0;
  }
  else {
    RVar1 = mpp_buffer_group_unused();
  }
  if (((byte)vpu_mem_debug & 1) != 0) {
    _mpp_log_l(4,0,"pool %p ret %d\n","get_free_memory_num",p,RVar1);
  }
  return RVar1;
}

Assistant:

static RK_S32 get_free_memory_num(vpu_display_mem_pool *p)
{
    vpu_display_mem_pool_impl *p_mempool = (vpu_display_mem_pool_impl *)p;
    RK_S32 ret = (p_mempool->group) ?
                 (mpp_buffer_group_unused(p_mempool->group)) : (0);

    vpu_mem_dbg_func("pool %p ret %d\n", p, ret);
    return ret;
}